

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

int32 mdef_phone_components
                (mdef_t *m,s3pid_t p,s3cipid_t *b,s3cipid_t *l,s3cipid_t *r,word_posn_t *pos)

{
  phone_t *ppVar1;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x18b,
                  "int32 mdef_phone_components(mdef_t *, s3pid_t, s3cipid_t *, s3cipid_t *, s3cipid_t *, word_posn_t *)"
                 );
  }
  if ((-1 < p) && (p < m->n_phone)) {
    ppVar1 = m->phone;
    *b = ppVar1[(uint)p].ci;
    *l = ppVar1[(uint)p].lc;
    *r = ppVar1[(uint)p].rc;
    *pos = ppVar1[(uint)p].wpos;
    return 0;
  }
  __assert_fail("(p >= 0) && (p < m->n_phone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x18c,
                "int32 mdef_phone_components(mdef_t *, s3pid_t, s3cipid_t *, s3cipid_t *, s3cipid_t *, word_posn_t *)"
               );
}

Assistant:

int32
mdef_phone_components(mdef_t * m,
                      s3pid_t p,
                      s3cipid_t * b,
                      s3cipid_t * l, s3cipid_t * r, word_posn_t * pos)
{
    assert(m);
    assert((p >= 0) && (p < m->n_phone));

    *b = m->phone[p].ci;
    *l = m->phone[p].lc;
    *r = m->phone[p].rc;
    *pos = m->phone[p].wpos;

    return 0;
}